

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

string * __thiscall AST::toStringTree_abi_cxx11_(string *__return_storage_ptr__,AST *this)

{
  AST *pAVar1;
  string local_40;
  RefCount<AST> local_20;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_40);
  local_40._M_dataplus._M_p = (pointer)(this->down).ref;
  if ((Ref *)local_40._M_dataplus._M_p == (Ref *)0x0) {
    local_40._M_dataplus._M_p = (pointer)0x0;
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_40);
  }
  else {
    ((Ref *)local_40._M_dataplus._M_p)->count = ((Ref *)local_40._M_dataplus._M_p)->count + 1;
    pAVar1 = ((Ref *)local_40._M_dataplus._M_p)->ptr;
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_40);
    if (pAVar1 != (AST *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getText_abi_cxx11_(&local_40,this);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_40);
      local_20.ref = (this->down).ref;
      (local_20.ref)->count = (local_20.ref)->count + 1;
      toStringList_abi_cxx11_(&local_40,(local_20.ref)->ptr);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_40);
      RefCount<AST>::~RefCount(&local_20);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getText_abi_cxx11_(&local_40,this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string AST::toStringTree() const
{
	//const AST* t=this;
	std::string ts="";
	if (getFirstChild()) {
		ts+=" ( ";
		ts+=toString();
		ts+=getFirstChild()->toStringList();
		ts+=" )";
	} else {
		ts+=" ";
		ts+=toString();
	}
	return ts;
}